

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O1

void proxy_negotiate(ProxySocket *ps)

{
  bufchain *ch;
  ProxyNegotiator *pPVar1;
  char *ptr;
  SockAddr *cmp;
  _STACK *p_Var2;
  size_t sVar3;
  ptrlen pVar4;
  
  pPVar1 = ps->pn;
  if (pPVar1 == (ProxyNegotiator *)0x0) {
    __assert_fail("ps->pn",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/proxy/proxy.c",
                  0xd3,"void proxy_negotiate(ProxySocket *)");
  }
  (*pPVar1->vt->process_queue)(pPVar1);
  pPVar1 = ps->pn;
  if (pPVar1->error != (char *)0x0) {
    ptr = dupprintf("Proxy error: %s");
    safefree(ps->pn->error);
    proxy_negotiator_cleanup(ps);
    (*ps->plug->vt->closing)(ps->plug,PLUGCLOSE_ERROR,ptr);
    safefree(ptr);
    return;
  }
  if (pPVar1->aborted == true) {
    proxy_negotiator_cleanup(ps);
    (*ps->plug->vt->closing)(ps->plug,PLUGCLOSE_USER_ABORT,"User aborted connection setup");
    return;
  }
  if (pPVar1->reconnect == true) {
    (*ps->sub_socket->vt->close)(ps->sub_socket);
    cmp = sk_addr_dup(ps->proxy_addr);
    p_Var2 = sk_new((cmp *)cmp);
    ps->sub_socket = (Socket *)p_Var2;
    ps->pn->reconnect = false;
    bufchain_clear(&ps->pending_input_data);
  }
  ch = &ps->output_from_negotiator;
  while( true ) {
    sVar3 = bufchain_size(ch);
    if (sVar3 == 0) break;
    pVar4 = bufchain_prefix(ch);
    (*ps->sub_socket->vt->write)(ps->sub_socket,pVar4.ptr,pVar4.len);
    bufchain_consume(ch,pVar4.len);
  }
  if (ps->pn->done == true) {
    proxy_activate(ps);
    return;
  }
  return;
}

Assistant:

static void proxy_negotiate(ProxySocket *ps)
{
    assert(ps->pn);
    proxy_negotiator_process_queue(ps->pn);

    if (ps->pn->error) {
        char *err = dupprintf("Proxy error: %s", ps->pn->error);
        sfree(ps->pn->error);
        proxy_negotiator_cleanup(ps);
        plug_closing_error(ps->plug, err);
        sfree(err);
        return;
    } else if (ps->pn->aborted) {
        proxy_negotiator_cleanup(ps);
        plug_closing_user_abort(ps->plug);
        return;
    }

    if (ps->pn->reconnect) {
        sk_close(ps->sub_socket);
        SockAddr *proxy_addr = sk_addr_dup(ps->proxy_addr);
        ps->sub_socket = sk_new(proxy_addr, ps->proxy_port,
                                ps->proxy_privport, ps->proxy_oobinline,
                                ps->proxy_nodelay, ps->proxy_keepalive,
                                &ps->plugimpl);
        ps->pn->reconnect = false;
        /* If the negotiator has asked us to reconnect, they are
         * expecting that on the next call their input queue will
         * consist entirely of data from the _new_ connection, without
         * any remaining data buffered from the old one. (If they'd
         * wanted the latter, they could have read it out of the input
         * queue before asking us to close the connection.) */
        bufchain_clear(&ps->pending_input_data);
    }

    while (bufchain_size(&ps->output_from_negotiator)) {
        ptrlen data = bufchain_prefix(&ps->output_from_negotiator);
        sk_write(ps->sub_socket, data.ptr, data.len);
        bufchain_consume(&ps->output_from_negotiator, data.len);
    }
    if (ps->pn->done)
        proxy_activate(ps);
}